

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::QMdiSubWindowPrivate(QMdiSubWindowPrivate *this)

{
  QRect *in_RDI;
  QMdiSubWindowPrivate *in_stack_00000088;
  nullptr_t in_stack_ffffffffffffffd8;
  QWidgetPrivate *in_stack_ffffffffffffffe8;
  Representation *pRVar1;
  Representation *local_10;
  
  QWidgetPrivate::QWidgetPrivate
            (in_stack_ffffffffffffffe8,(QtPrivate_6_10_0)((ulong)in_RDI >> 0x20));
  *(undefined ***)in_RDI = &PTR__QMdiSubWindowPrivate_00d172a0;
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)in_RDI,in_stack_ffffffffffffffd8);
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)in_RDI,in_stack_ffffffffffffffd8);
  QPointer<QMdi::ControlContainer>::QPointer
            ((QPointer<QMdi::ControlContainer> *)in_RDI,in_stack_ffffffffffffffd8);
  QPointer<QSizeGrip>::QPointer((QPointer<QSizeGrip> *)in_RDI,in_stack_ffffffffffffffd8);
  in_RDI[0x29].x2 = 0;
  in_RDI[0x29].y2 = 0;
  QPoint::QPoint((QPoint *)in_RDI);
  QRect::QRect(in_RDI);
  QSize::QSize((QSize *)in_RDI);
  QSize::QSize((QSize *)in_RDI,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
               (int)in_stack_ffffffffffffffd8);
  QSize::QSize((QSize *)in_RDI);
  *(undefined1 *)&in_RDI[0x2d].x1.m_i = 1;
  *(undefined1 *)((long)&in_RDI[0x2d].x1.m_i + 1) = 1;
  *(undefined1 *)((long)&in_RDI[0x2d].x1.m_i + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0x2d].x1.m_i + 3) = 0;
  *(undefined1 *)&in_RDI[0x2d].y1.m_i = 0;
  *(undefined1 *)((long)&in_RDI[0x2d].y1.m_i + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x2d].y1.m_i + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0x2d].y1.m_i + 3) = 1;
  *(undefined1 *)&in_RDI[0x2d].x2.m_i = 0;
  *(undefined1 *)((long)&in_RDI[0x2d].x2.m_i + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x2d].x2.m_i + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0x2d].x2.m_i + 3) = 0;
  *(undefined1 *)&in_RDI[0x2d].y2.m_i = 0;
  in_RDI[0x2e].x1.m_i = 5;
  in_RDI[0x2e].y1.m_i = 0x14;
  QBasicTimer::QBasicTimer((QBasicTimer *)&in_RDI[0x2e].x2);
  in_RDI[0x2e].y2.m_i = 0;
  in_RDI[0x2f].x1.m_i = 0;
  in_RDI[0x2f].y1.m_i = 0;
  in_RDI[0x2f].x2.m_i = 3;
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::QMap
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)0x62cb00)
  ;
  QPointer<QMenu>::QPointer((QPointer<QMenu> *)0x62cb11);
  local_10 = &in_RDI[0x31].x2;
  pRVar1 = &in_RDI[0x38].x2;
  do {
    QPointer<QAction>::QPointer((QPointer<QAction> *)0x62cb3b);
    local_10 = local_10 + 4;
  } while (local_10 != pRVar1);
  QFlags<QMdiSubWindow::SubWindowOption>::QFlags((QFlags<QMdiSubWindow::SubWindowOption> *)0x62cb63)
  ;
  QString::QString((QString *)0x62cb74);
  QPalette::QPalette((QPalette *)&in_RDI[0x3a].x2);
  QString::QString((QString *)0x62cb96);
  QFont::QFont((QFont *)(in_RDI + 0x3d));
  QIcon::QIcon((QIcon *)(in_RDI + 0x3e));
  QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)0x62cbc9);
  QString::QString((QString *)0x62cbda);
  initOperationMap(in_stack_00000088);
  return;
}

Assistant:

QMdiSubWindowPrivate::QMdiSubWindowPrivate()
    : baseWidget(nullptr),
      restoreFocusWidget(nullptr),
      controlContainer(nullptr),
#if QT_CONFIG(sizegrip)
      sizeGrip(nullptr),
#endif
#if QT_CONFIG(rubberband)
      rubberBand(nullptr),
#endif
      userMinimumSize(0,0),
      resizeEnabled(true),
      moveEnabled(true),
      isInInteractiveMode(false),
#if QT_CONFIG(rubberband)
      isInRubberBandMode(false),
#endif
      isShadeMode(false),
      ignoreWindowTitleChange(false),
      ignoreNextActivationEvent(false),
      activationEnabled(true),
      isShadeRequestFromMinimizeMode(false),
      isMaximizeMode(false),
      isWidgetHiddenByUs(false),
      isActive(false),
      isExplicitlyDeactivated(false),
      keyboardSingleStep(5),
      keyboardPageStep(20),
      currentOperation(None),
      hoveredSubControl(QStyle::SC_None),
      activeSubControl(QStyle::SC_None),
      focusInReason(Qt::ActiveWindowFocusReason)
{
    initOperationMap();
}